

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O3

Node * __thiscall
MarkerIndex::Iterator::insert_splice_boundary(Iterator *this,Point *position,bool is_insertion_end)

{
  int iVar1;
  Node **ppNVar2;
  
  reset(this);
  iVar1 = Point::compare(position,&this->current_node_position);
  do {
    if (iVar1 == 0 && !is_insertion_end) {
LAB_00161680:
      ppNVar2 = &((Node *)this)->left;
LAB_00161684:
      return *ppNVar2;
    }
    if (iVar1 < 0) {
      if (this->current_node->left == (Node *)0x0) {
        insert_left_child(this,position);
        this = (Iterator *)this->current_node;
        goto LAB_00161680;
      }
      descend_left(this);
    }
    else {
      if (this->current_node->right == (Node *)0x0) {
        insert_right_child(this,position);
        ppNVar2 = &this->current_node->right;
        goto LAB_00161684;
      }
      descend_right(this);
    }
    iVar1 = Point::compare(position,&this->current_node_position);
  } while( true );
}

Assistant:

MarkerIndex::Node *MarkerIndex::Iterator::insert_splice_boundary(const Point &position, bool is_insertion_end) {
  reset();

  while (true) {
    int comparison = position.compare(current_node_position);
    if (comparison == 0 && !is_insertion_end) {
      return current_node;
    } else if (comparison < 0) {
      if (current_node->left) {
        descend_left();
      } else {
        insert_left_child(position);
        return current_node->left;
      }
    } else { // comparison > 0
      if (current_node->right) {
        descend_right();
      } else {
        insert_right_child(position);
        return current_node->right;
      }
    }
  }
}